

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

cf_filetype_t cf_file_type(cf_char_t *path)

{
  int iVar1;
  uint uVar2;
  cf_filetype_t cVar3;
  stat st;
  stat sStack_98;
  
  cVar3 = CF_FILE_TYPE_UNKNOWN;
  if (path != (cf_char_t *)0x0) {
    iVar1 = stat(path,&sStack_98);
    if (iVar1 == 0) {
      uVar2 = (sStack_98.st_mode & 0xf000) - 0x1000;
      cVar3 = CF_FILE_TYPE_NOT_DEF;
      if (uVar2 < 0xc000) {
        cVar3 = *(cf_filetype_t *)(&DAT_00105600 + (uVar2 >> 10));
      }
    }
  }
  return cVar3;
}

Assistant:

cf_filetype_t cf_file_type(const cf_char_t* path) {
    struct stat st;
    if(!path) return CF_FILE_TYPE_UNKNOWN;

    if(stat(path, &st) != 0) return CF_FILE_TYPE_UNKNOWN;
    
    switch(st.st_mode & S_IFMT) {
#ifndef CF_OS_WIN
    case S_IFSOCK:
        return CF_FILE_TYPE_SOCK;
    case S_IFLNK: 
        return CF_FILE_TYPE_LINK;
#endif
    case S_IFREG: 
        return CF_FILE_TYPE_REGULAR;
#ifndef CF_OS_WIN
    case S_IFBLK: 
        return CF_FILE_TYPE_BLOCK;
#endif
    case S_IFDIR: 
        return CF_FILE_TYPE_DIR;
    case S_IFCHR: 
        return CF_FILE_TYPE_CHAR;
#ifndef CF_OS_WIN
    case S_IFIFO: 
        return CF_FILE_TYPE_PIPE;
#endif
    default: 
        return CF_FILE_TYPE_NOT_DEF;
    }
}